

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqast.h
# Opt level: O3

void __thiscall SQCompilation::Block::addStatement(Block *this,Statement *stmt)

{
  uint uVar1;
  Statement **__dest;
  ulong uVar2;
  
  uVar1 = (this->_statements)._size;
  if (uVar1 < (this->_statements)._allocated) {
    __dest = (this->_statements)._vals;
  }
  else {
    uVar2 = 4;
    if (uVar1 * 2 != 0) {
      uVar2 = (ulong)(uVar1 * 2);
    }
    __dest = (Statement **)Arena::allocate((this->_statements)._arena,uVar2 * 8);
    memcpy(__dest,(this->_statements)._vals,(ulong)(this->_statements)._size << 3);
    (this->_statements)._vals = __dest;
    (this->_statements)._allocated = (size_type_conflict)uVar2;
    uVar1 = (this->_statements)._size;
  }
  (this->_statements)._size = uVar1 + 1;
  __dest[uVar1] = stmt;
  return;
}

Assistant:

void addStatement(Statement *stmt) { assert(stmt); _statements.push_back(stmt); }